

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void __thiscall
embree::sse42::
BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
::intersect(BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::ObjectIntersectorK<4,_false>_>,_false>
            *this,vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  RayQueryContext *pRVar3;
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  size_t bits;
  long lVar7;
  ulong uVar8;
  code *pcVar9;
  ulong uVar10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar11;
  undefined4 uVar12;
  size_t sVar13;
  RayQueryContext *pRVar14;
  int iVar15;
  NodeRef nodeRef;
  RayQueryContext *pRVar16;
  RayQueryContext *pRVar17;
  NodeRef *pNVar18;
  bool bVar19;
  float fVar20;
  float fVar31;
  float fVar32;
  vint4 bi;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar33 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar34;
  float fVar35;
  float fVar40;
  float fVar41;
  vint4 bi_1;
  float fVar42;
  undefined1 auVar36 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar43;
  float fVar45;
  float fVar46;
  vint4 ai;
  float fVar47;
  undefined1 auVar44 [16];
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  vint4 ai_1;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar58;
  float fVar59;
  vint4 ai_3;
  undefined1 auVar57 [16];
  float fVar60;
  uint uVar62;
  uint uVar63;
  vint4 bi_2;
  uint uVar64;
  undefined1 auVar61 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  vint4 bi_3;
  undefined1 auVar66 [16];
  uint uVar69;
  float fVar72;
  uint uVar73;
  uint uVar74;
  vint4 ai_2;
  float fVar75;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  uint uVar76;
  float fVar77;
  int iVar78;
  int iVar79;
  float fVar80;
  int iVar81;
  float fVar82;
  float fVar85;
  float fVar86;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar87;
  float fVar88;
  float fVar90;
  float fVar91;
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  float fVar95;
  float fVar96;
  undefined1 in_XMM12 [16];
  undefined1 auVar94 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 in_XMM13 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  vint4 bi_8;
  undefined1 local_17b8 [16];
  vint<4> *local_17a0;
  undefined8 local_1798;
  uint local_1790;
  size_t local_1788;
  Intersectors *local_1780;
  undefined4 local_1778;
  uint local_1774;
  ulong local_1770;
  undefined8 local_1768;
  long local_1760;
  float local_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float local_1748;
  float fStack_1744;
  float fStack_1740;
  float fStack_173c;
  float local_1738;
  float fStack_1734;
  float fStack_1730;
  float fStack_172c;
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  float local_1718;
  float fStack_1714;
  float fStack_1710;
  float fStack_170c;
  float local_1708;
  float fStack_1704;
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  lVar7 = (valid_i->field_0).v[0];
  pRVar16 = *(RayQueryContext **)(lVar7 + 0x70);
  if (pRVar16 != (RayQueryContext *)0x8) {
    if ((*(long *)(ray + 8) != 0) &&
       (lVar7 = *(long *)(ray + 0x10), (*(byte *)(lVar7 + 2) & 1) != 0)) {
      intersectCoherent((vint<4> *)this,(Intersectors *)valid_i,(RayHitK<4> *)This,
                        (RayQueryContext *)ray);
      return;
    }
    auVar27._8_4_ = 0xffffffff;
    auVar27._0_8_ = 0xffffffffffffffff;
    auVar27._12_4_ = 0xffffffff;
    auVar71._0_4_ = -(uint)(*(int *)this == -1);
    auVar71._4_4_ = -(uint)(*(int *)(this + 4) == -1);
    auVar71._8_4_ = -(uint)(*(int *)(this + 8) == -1);
    auVar71._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
    iVar5 = movmskps((int)lVar7,auVar71);
    uVar8 = CONCAT44((int)((ulong)lVar7 >> 0x20),iVar5);
    if (iVar5 != 0) {
      auVar26._0_8_ = (This->intersector4).intersect;
      auVar26._8_8_ = (This->intersector4).occluded;
      fVar72 = (float)((ulong)auVar26._0_8_ >> 0x20);
      fVar75 = (float)((ulong)auVar26._8_8_ >> 0x20);
      fVar48 = (float)DAT_01f80d30;
      fVar50 = DAT_01f80d30._4_4_;
      fVar52 = DAT_01f80d30._8_4_;
      fVar54 = DAT_01f80d30._12_4_;
      auVar57._4_4_ = -(uint)(ABS(fVar72) < fVar50);
      auVar57._0_4_ = -(uint)(ABS((float)auVar26._0_8_) < fVar48);
      auVar57._8_4_ = -(uint)(ABS((float)auVar26._8_8_) < fVar52);
      auVar57._12_4_ = -(uint)(ABS(fVar75) < fVar54);
      auVar57 = blendvps(auVar26,_DAT_01f80d30,auVar57);
      auVar1 = *(undefined1 (*) [16])&(This->intersector4).name;
      auVar89._4_4_ = -(uint)(ABS(auVar1._4_4_) < fVar50);
      auVar89._0_4_ = -(uint)(ABS(auVar1._0_4_) < fVar48);
      auVar89._8_4_ = -(uint)(ABS(auVar1._8_4_) < fVar52);
      auVar89._12_4_ = -(uint)(ABS(auVar1._12_4_) < fVar54);
      auVar83 = blendvps(auVar1,_DAT_01f80d30,auVar89);
      auVar2._0_8_ = (This->intersector4_filter).occluded;
      auVar2._8_8_ = (This->intersector4_filter).name;
      fVar77 = (float)((ulong)auVar2._0_8_ >> 0x20);
      fVar80 = (float)((ulong)auVar2._8_8_ >> 0x20);
      auVar94._4_4_ = -(uint)(ABS(fVar77) < fVar50);
      auVar94._0_4_ = -(uint)(ABS((float)auVar2._0_8_) < fVar48);
      auVar94._8_4_ = -(uint)(ABS((float)auVar2._8_8_) < fVar52);
      auVar94._12_4_ = -(uint)(ABS(fVar80) < fVar54);
      auVar89 = blendvps(auVar2,_DAT_01f80d30,auVar94);
      auVar94 = rcpps(in_XMM12,auVar57);
      fVar93 = auVar94._0_4_;
      fVar95 = auVar94._4_4_;
      fVar96 = auVar94._8_4_;
      fVar97 = auVar94._12_4_;
      auVar94 = rcpps(in_XMM13,auVar83);
      fVar98 = auVar94._0_4_;
      auVar84._0_4_ = auVar83._0_4_ * fVar98;
      fVar99 = auVar94._4_4_;
      auVar84._4_4_ = auVar83._4_4_ * fVar99;
      fVar100 = auVar94._8_4_;
      auVar84._8_4_ = auVar83._8_4_ * fVar100;
      fVar101 = auVar94._12_4_;
      auVar84._12_4_ = auVar83._12_4_ * fVar101;
      auVar83 = rcpps(auVar84,auVar89);
      fVar82 = auVar83._0_4_;
      fVar85 = auVar83._4_4_;
      fVar86 = auVar83._8_4_;
      fVar87 = auVar83._12_4_;
      auVar70._0_8_ =
           CONCAT44(-(uint)(fVar72 < 0.0),-(uint)((float)auVar26._0_8_ < 0.0)) & 0x100000001;
      auVar70._8_4_ = -(uint)((float)auVar26._8_8_ < 0.0) & 1;
      auVar70._12_4_ = -(uint)(fVar75 < 0.0) & 1;
      auVar66._0_8_ =
           CONCAT44(-(uint)(auVar1._4_4_ < 0.0),-(uint)(auVar1._0_4_ < 0.0)) & 0x200000002;
      auVar66._8_4_ = -(uint)(auVar1._8_4_ < 0.0) & 2;
      auVar66._12_4_ = -(uint)(auVar1._12_4_ < 0.0) & 2;
      fVar88 = *(float *)&This->ptr;
      fVar90 = *(float *)((long)&This->ptr + 4);
      fVar91 = *(float *)&This->leafIntersector;
      fVar92 = *(float *)((long)&This->leafIntersector + 4);
      fVar48 = *(float *)&(This->collider).collide;
      fVar50 = *(float *)((long)&(This->collider).collide + 4);
      fVar52 = *(float *)&(This->collider).name;
      fVar54 = *(float *)((long)&(This->collider).name + 4);
      fVar72 = *(float *)&(This->intersector1).intersect;
      fVar75 = *(float *)((long)&(This->intersector1).intersect + 4);
      fVar102 = *(float *)&(This->intersector1).occluded;
      fVar103 = *(float *)((long)&(This->intersector1).occluded + 4);
      auVar83._8_4_ = -(uint)((float)auVar2._8_8_ < 0.0) & 4;
      auVar83._0_8_ =
           CONCAT44(-(uint)(fVar77 < 0.0),-(uint)((float)auVar2._0_8_ < 0.0)) & 0x400000004;
      auVar83._12_4_ = -(uint)(fVar80 < 0.0) & 4;
      auVar1._0_8_ = (This->intersector1).pointQuery;
      auVar1._8_8_ = (This->intersector1).name;
      local_17b8 = auVar71 ^ auVar27 | auVar83 | auVar66 | auVar70;
      do {
        lVar7 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
          }
        }
        iVar5 = *(int *)(local_17b8 + lVar7 * 4);
        auVar21._0_4_ = -(uint)(iVar5 == local_17b8._0_4_);
        auVar21._4_4_ = -(uint)(iVar5 == local_17b8._4_4_);
        auVar21._8_4_ = -(uint)(iVar5 == local_17b8._8_4_);
        auVar21._12_4_ = -(uint)(iVar5 == local_17b8._12_4_);
        uVar12 = movmskps((int)lVar7,auVar21);
        sVar13 = ~CONCAT44((int)((ulong)lVar7 >> 0x20),uVar12);
        uVar8 = uVar8 & sVar13;
      } while (uVar8 != 0);
      local_17b8._8_4_ = 0xffffffff;
      local_17b8._0_8_ = 0xffffffffffffffff;
      local_17b8._12_4_ = 0xffffffff;
      auVar33._0_4_ = -(uint)(*(int *)this == -1);
      auVar33._4_4_ = -(uint)(*(int *)(this + 4) == -1);
      auVar33._8_4_ = -(uint)(*(int *)(this + 8) == -1);
      auVar33._12_4_ = -(uint)(*(int *)(this + 0xc) == -1);
      auVar71 = maxps(auVar1,ZEXT816(0));
      iVar5 = (int)DAT_01f7a9f0;
      iVar78 = DAT_01f7a9f0._4_4_;
      iVar79 = DAT_01f7a9f0._8_4_;
      iVar81 = DAT_01f7a9f0._12_4_;
      local_16f8.v = (__m128)blendvps(_DAT_01f7a9f0,auVar71,auVar33);
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_near[0].field_0 = _DAT_01f7a9f0;
      stack_node[1].ptr = (size_t)pRVar16;
      stack_near[1].field_0 = local_16f8;
      if (pRVar16 != (RayQueryContext *)&DAT_fffffffffffffff8) {
        fVar93 = fVar93 + (1.0 - auVar57._0_4_ * fVar93) * fVar93;
        fVar95 = fVar95 + (1.0 - auVar57._4_4_ * fVar95) * fVar95;
        fVar96 = fVar96 + (1.0 - auVar57._8_4_ * fVar96) * fVar96;
        fVar97 = fVar97 + (1.0 - auVar57._12_4_ * fVar97) * fVar97;
        fVar98 = fVar98 + (1.0 - auVar84._0_4_) * fVar98;
        fVar99 = fVar99 + (1.0 - auVar84._4_4_) * fVar99;
        fVar100 = fVar100 + (1.0 - auVar84._8_4_) * fVar100;
        fVar101 = fVar101 + (1.0 - auVar84._12_4_) * fVar101;
        fVar82 = fVar82 + (1.0 - auVar89._0_4_ * fVar82) * fVar82;
        fVar85 = fVar85 + (1.0 - auVar89._4_4_ * fVar85) * fVar85;
        fVar86 = fVar86 + (1.0 - auVar89._8_4_ * fVar86) * fVar86;
        fVar87 = fVar87 + (1.0 - auVar89._12_4_ * fVar87) * fVar87;
        pNVar18 = stack_node + 1;
        auVar71 = maxps(*(undefined1 (*) [16])&(This->intersector4_nofilter).name,_DAT_01f7aa10);
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       blendvps(_DAT_01f7aa00,auVar71,auVar33);
        paVar11 = &stack_near[2].field_0;
        local_1708 = fVar93;
        fStack_1704 = fVar95;
        fStack_1700 = fVar96;
        fStack_16fc = fVar97;
        local_1718 = fVar98;
        fStack_1714 = fVar99;
        fStack_1710 = fVar100;
        fStack_170c = fVar101;
        local_1728 = fVar82;
        fStack_1724 = fVar85;
        fStack_1720 = fVar86;
        fStack_171c = fVar87;
        local_1738 = fVar88;
        fStack_1734 = fVar90;
        fStack_1730 = fVar91;
        fStack_172c = fVar92;
        local_1748 = fVar48;
        fStack_1744 = fVar50;
        fStack_1740 = fVar52;
        fStack_173c = fVar54;
        local_1758 = fVar72;
        fStack_1754 = fVar75;
        fStack_1750 = fVar102;
        fStack_174c = fVar103;
        local_1770 = 0;
        do {
          aVar37 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar11[-1].v;
          paVar11 = paVar11 + -1;
          auVar22._4_4_ = -(uint)(aVar37.v[1] < (float)bi_8.field_0.i[1]);
          auVar22._0_4_ = -(uint)(aVar37.v[0] < (float)bi_8.field_0.i[0]);
          auVar22._8_4_ = -(uint)(aVar37.v[2] < (float)bi_8.field_0.i[2]);
          auVar22._12_4_ = -(uint)(aVar37._12_4_ < (float)bi_8.field_0.i[3]);
          uVar6 = movmskps((int)local_1770,auVar22);
          local_1770 = (ulong)uVar6;
          if (uVar6 != 0) {
            while (((ulong)pRVar16 & 8) == 0) {
              sVar13 = 0;
              local_1770 = 0;
              aVar34.i[1] = iVar78;
              aVar34.i[0] = iVar5;
              aVar34.i[2] = iVar79;
              aVar34.i[3] = iVar81;
              pRVar17 = (RayQueryContext *)0x8;
              do {
                pRVar3 = *(RayQueryContext **)(((ulong)pRVar16 & 0xfffffffffffffff0) + sVar13 * 8);
                aVar37 = aVar34;
                if (pRVar3 == (RayQueryContext *)0x8) break;
                fVar77 = *(float *)((long)&pRVar16[1].user + sVar13 * 4);
                fVar80 = *(float *)((long)&pRVar16[2].scene + sVar13 * 4);
                fVar20 = *(float *)((long)&pRVar16[2].args + sVar13 * 4);
                fVar42 = *(float *)((long)&pRVar16[3].user + sVar13 * 4);
                fVar43 = (fVar77 - fVar88) * fVar93;
                fVar45 = (fVar77 - fVar90) * fVar95;
                fVar46 = (fVar77 - fVar91) * fVar96;
                fVar47 = (fVar77 - fVar92) * fVar97;
                fVar49 = (fVar20 - fVar48) * fVar98;
                fVar51 = (fVar20 - fVar50) * fVar99;
                fVar53 = (fVar20 - fVar52) * fVar100;
                fVar55 = (fVar20 - fVar54) * fVar101;
                fVar77 = *(float *)((long)&pRVar16[4].scene + sVar13 * 4);
                fVar56 = (fVar77 - fVar72) * fVar82;
                fVar58 = (fVar77 - fVar75) * fVar85;
                fVar59 = (fVar77 - fVar102) * fVar86;
                fVar60 = (fVar77 - fVar103) * fVar87;
                fVar20 = (fVar80 - fVar88) * fVar93;
                fVar31 = (fVar80 - fVar90) * fVar95;
                fVar32 = (fVar80 - fVar91) * fVar96;
                fVar80 = (fVar80 - fVar92) * fVar97;
                fVar35 = (fVar42 - fVar48) * fVar98;
                fVar40 = (fVar42 - fVar50) * fVar99;
                fVar41 = (fVar42 - fVar52) * fVar100;
                fVar42 = (fVar42 - fVar54) * fVar101;
                fVar77 = *(float *)((long)&pRVar16[4].args + sVar13 * 4);
                fVar65 = (fVar77 - fVar72) * fVar82;
                fVar67 = (fVar77 - fVar75) * fVar85;
                fVar68 = (fVar77 - fVar102) * fVar86;
                fVar77 = (fVar77 - fVar103) * fVar87;
                uVar6 = (uint)((int)fVar20 < (int)fVar43) * (int)fVar20 |
                        (uint)((int)fVar20 >= (int)fVar43) * (int)fVar43;
                uVar62 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar31 |
                         (uint)((int)fVar31 >= (int)fVar45) * (int)fVar45;
                uVar63 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar32 |
                         (uint)((int)fVar32 >= (int)fVar46) * (int)fVar46;
                uVar64 = (uint)((int)fVar80 < (int)fVar47) * (int)fVar80 |
                         (uint)((int)fVar80 >= (int)fVar47) * (int)fVar47;
                uVar69 = (uint)((int)fVar35 < (int)fVar49) * (int)fVar35 |
                         (uint)((int)fVar35 >= (int)fVar49) * (int)fVar49;
                uVar73 = (uint)((int)fVar40 < (int)fVar51) * (int)fVar40 |
                         (uint)((int)fVar40 >= (int)fVar51) * (int)fVar51;
                uVar74 = (uint)((int)fVar41 < (int)fVar53) * (int)fVar41 |
                         (uint)((int)fVar41 >= (int)fVar53) * (int)fVar53;
                uVar76 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar42 |
                         (uint)((int)fVar42 >= (int)fVar55) * (int)fVar55;
                uVar69 = ((int)uVar69 < (int)uVar6) * uVar6 | ((int)uVar69 >= (int)uVar6) * uVar69;
                uVar73 = ((int)uVar73 < (int)uVar62) * uVar62 |
                         ((int)uVar73 >= (int)uVar62) * uVar73;
                uVar74 = ((int)uVar74 < (int)uVar63) * uVar63 |
                         ((int)uVar74 >= (int)uVar63) * uVar74;
                uVar76 = ((int)uVar76 < (int)uVar64) * uVar64 |
                         ((int)uVar76 >= (int)uVar64) * uVar76;
                uVar6 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar65 |
                        (uint)((int)fVar65 >= (int)fVar56) * (int)fVar56;
                uVar62 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar67 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar58;
                uVar63 = (uint)((int)fVar68 < (int)fVar59) * (int)fVar68 |
                         (uint)((int)fVar68 >= (int)fVar59) * (int)fVar59;
                uVar64 = (uint)((int)fVar77 < (int)fVar60) * (int)fVar77 |
                         (uint)((int)fVar77 >= (int)fVar60) * (int)fVar60;
                auVar61._0_4_ =
                     ((int)uVar6 < (int)uVar69) * uVar69 | ((int)uVar6 >= (int)uVar69) * uVar6;
                auVar61._4_4_ =
                     ((int)uVar62 < (int)uVar73) * uVar73 | ((int)uVar62 >= (int)uVar73) * uVar62;
                auVar61._8_4_ =
                     ((int)uVar63 < (int)uVar74) * uVar74 | ((int)uVar63 >= (int)uVar74) * uVar63;
                auVar61._12_4_ =
                     ((int)uVar64 < (int)uVar76) * uVar76 | ((int)uVar64 >= (int)uVar76) * uVar64;
                uVar6 = (uint)((int)fVar20 < (int)fVar43) * (int)fVar43 |
                        (uint)((int)fVar20 >= (int)fVar43) * (int)fVar20;
                uVar62 = (uint)((int)fVar31 < (int)fVar45) * (int)fVar45 |
                         (uint)((int)fVar31 >= (int)fVar45) * (int)fVar31;
                uVar63 = (uint)((int)fVar32 < (int)fVar46) * (int)fVar46 |
                         (uint)((int)fVar32 >= (int)fVar46) * (int)fVar32;
                uVar64 = (uint)((int)fVar80 < (int)fVar47) * (int)fVar47 |
                         (uint)((int)fVar80 >= (int)fVar47) * (int)fVar80;
                uVar69 = (uint)((int)fVar35 < (int)fVar49) * (int)fVar49 |
                         (uint)((int)fVar35 >= (int)fVar49) * (int)fVar35;
                uVar73 = (uint)((int)fVar40 < (int)fVar51) * (int)fVar51 |
                         (uint)((int)fVar40 >= (int)fVar51) * (int)fVar40;
                uVar74 = (uint)((int)fVar41 < (int)fVar53) * (int)fVar53 |
                         (uint)((int)fVar41 >= (int)fVar53) * (int)fVar41;
                uVar76 = (uint)((int)fVar42 < (int)fVar55) * (int)fVar55 |
                         (uint)((int)fVar42 >= (int)fVar55) * (int)fVar42;
                uVar6 = ((int)uVar6 < (int)uVar69) * uVar6 | ((int)uVar6 >= (int)uVar69) * uVar69;
                uVar62 = ((int)uVar62 < (int)uVar73) * uVar62 |
                         ((int)uVar62 >= (int)uVar73) * uVar73;
                uVar63 = ((int)uVar63 < (int)uVar74) * uVar63 |
                         ((int)uVar63 >= (int)uVar74) * uVar74;
                uVar64 = ((int)uVar64 < (int)uVar76) * uVar64 |
                         ((int)uVar64 >= (int)uVar76) * uVar76;
                uVar69 = (uint)((int)fVar65 < (int)fVar56) * (int)fVar56 |
                         (uint)((int)fVar65 >= (int)fVar56) * (int)fVar65;
                uVar73 = (uint)((int)fVar67 < (int)fVar58) * (int)fVar58 |
                         (uint)((int)fVar67 >= (int)fVar58) * (int)fVar67;
                uVar74 = (uint)((int)fVar68 < (int)fVar59) * (int)fVar59 |
                         (uint)((int)fVar68 >= (int)fVar59) * (int)fVar68;
                uVar76 = (uint)((int)fVar77 < (int)fVar60) * (int)fVar60 |
                         (uint)((int)fVar77 >= (int)fVar60) * (int)fVar77;
                uVar69 = (uint)(bi_8.field_0.i[0] < (int)uVar69) * bi_8.field_0.i[0] |
                         (bi_8.field_0.i[0] >= (int)uVar69) * uVar69;
                uVar73 = (uint)(bi_8.field_0.i[1] < (int)uVar73) * bi_8.field_0.i[1] |
                         (bi_8.field_0.i[1] >= (int)uVar73) * uVar73;
                uVar74 = (uint)(bi_8.field_0.i[2] < (int)uVar74) * bi_8.field_0.i[2] |
                         (bi_8.field_0.i[2] >= (int)uVar74) * uVar74;
                uVar76 = (uint)(bi_8.field_0.i[3] < (int)uVar76) * bi_8.field_0.i[3] |
                         (bi_8.field_0.i[3] >= (int)uVar76) * uVar76;
                auVar23._4_4_ =
                     -(uint)((float)((uint)((int)auVar61._4_4_ < (int)local_16f8._4_4_) *
                                     local_16f8._4_4_ |
                                    ((int)auVar61._4_4_ >= (int)local_16f8._4_4_) * auVar61._4_4_)
                            <= (float)(((int)uVar62 < (int)uVar73) * uVar62 |
                                      ((int)uVar62 >= (int)uVar73) * uVar73));
                auVar23._0_4_ =
                     -(uint)((float)((uint)((int)auVar61._0_4_ < (int)local_16f8._0_4_) *
                                     local_16f8._0_4_ |
                                    ((int)auVar61._0_4_ >= (int)local_16f8._0_4_) * auVar61._0_4_)
                            <= (float)(((int)uVar6 < (int)uVar69) * uVar6 |
                                      ((int)uVar6 >= (int)uVar69) * uVar69));
                auVar23._8_4_ =
                     -(uint)((float)((uint)((int)auVar61._8_4_ < (int)local_16f8._8_4_) *
                                     local_16f8._8_4_ |
                                    ((int)auVar61._8_4_ >= (int)local_16f8._8_4_) * auVar61._8_4_)
                            <= (float)(((int)uVar63 < (int)uVar74) * uVar63 |
                                      ((int)uVar63 >= (int)uVar74) * uVar74));
                auVar23._12_4_ =
                     -(uint)((float)((uint)((int)auVar61._12_4_ < (int)local_16f8._12_4_) *
                                     local_16f8._12_4_ |
                                    ((int)auVar61._12_4_ >= (int)local_16f8._12_4_) * auVar61._12_4_
                                    ) <=
                            (float)(((int)uVar64 < (int)uVar76) * uVar64 |
                                   ((int)uVar64 >= (int)uVar76) * uVar76));
                uVar6 = movmskps((int)context,auVar23);
                context = (RayQueryContext *)(ulong)uVar6;
                if (uVar6 != 0) {
                  auVar36._4_4_ = iVar78;
                  auVar36._0_4_ = iVar5;
                  auVar36._8_4_ = iVar79;
                  auVar36._12_4_ = iVar81;
                  aVar37 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                           blendvps(auVar36,auVar61,auVar23);
                  auVar24._4_4_ = -(uint)(aVar37.v[1] < aVar34.v[1]);
                  auVar24._0_4_ = -(uint)(aVar37.v[0] < aVar34.v[0]);
                  auVar24._8_4_ = -(uint)(aVar37.v[2] < aVar34.v[2]);
                  auVar24._12_4_ = -(uint)(aVar37.v[3] < aVar34.v[3]);
                  iVar15 = movmskps(uVar6,auVar24);
                  pRVar14 = pRVar17;
                  context = pRVar3;
                  aVar25 = aVar37;
                  if ((iVar15 == 0) ||
                     (bVar19 = pRVar17 != (RayQueryContext *)0x8, pRVar14 = pRVar3,
                     context = pRVar17, pRVar17 = pRVar3, aVar25 = aVar34, aVar34 = aVar37, bVar19))
                  {
                    aVar37 = aVar34;
                    local_1770 = local_1770 + 1;
                    pNVar18->ptr = (size_t)context;
                    pNVar18 = pNVar18 + 1;
                    *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar11->v = aVar25;
                    paVar11 = paVar11 + 1;
                    pRVar17 = pRVar14;
                  }
                }
                sVar13 = sVar13 + 1;
                aVar34 = aVar37;
              } while (sVar13 != 4);
              if (pRVar17 == (RayQueryContext *)0x8) goto LAB_00240e9b;
              pRVar16 = pRVar17;
              if (1 < local_1770) {
                auVar71 = *(undefined1 (*) [16])paVar11[-2].v;
                auVar27 = *(undefined1 (*) [16])paVar11[-1].v;
                auVar38._4_4_ = -(uint)(auVar71._4_4_ < auVar27._4_4_);
                auVar38._0_4_ = -(uint)(auVar71._0_4_ < auVar27._0_4_);
                auVar38._8_4_ = -(uint)(auVar71._8_4_ < auVar27._8_4_);
                auVar38._12_4_ = -(uint)(auVar71._12_4_ < auVar27._12_4_);
                uVar6 = movmskps((int)sVar13,auVar38);
                sVar13 = (size_t)uVar6;
                auVar26 = auVar27;
                if (uVar6 != 0) {
                  *(undefined1 (*) [16])paVar11[-2].v = auVar27;
                  *(undefined1 (*) [16])paVar11[-1].v = auVar71;
                  auVar26 = *(undefined1 (*) [16])(pNVar18 + -2);
                  auVar39._0_8_ = auVar26._8_8_;
                  auVar39._8_4_ = auVar26._0_4_;
                  auVar39._12_4_ = auVar26._4_4_;
                  *(undefined1 (*) [16])(pNVar18 + -2) = auVar39;
                  auVar26 = auVar71;
                  auVar71 = auVar27;
                }
                if (local_1770 != 2) {
                  auVar27 = *(undefined1 (*) [16])paVar11[-3].v;
                  auVar4._4_4_ = -(uint)(auVar27._4_4_ < auVar26._4_4_);
                  auVar4._0_4_ = -(uint)(auVar27._0_4_ < auVar26._0_4_);
                  auVar4._8_4_ = -(uint)(auVar27._8_4_ < auVar26._8_4_);
                  auVar4._12_4_ = -(uint)(auVar27._12_4_ < auVar26._12_4_);
                  uVar6 = movmskps((int)local_1770,auVar4);
                  uVar8 = (ulong)uVar6;
                  if (uVar6 != 0) {
                    *(undefined1 (*) [16])paVar11[-3].v = auVar26;
                    *(undefined1 (*) [16])paVar11[-1].v = auVar27;
                    uVar8 = pNVar18[-3].ptr;
                    sVar13 = pNVar18[-1].ptr;
                    pNVar18[-3].ptr = sVar13;
                    pNVar18[-1].ptr = uVar8;
                    auVar27 = auVar26;
                  }
                  auVar44._4_4_ = -(uint)(auVar27._4_4_ < auVar71._4_4_);
                  auVar44._0_4_ = -(uint)(auVar27._0_4_ < auVar71._0_4_);
                  auVar44._8_4_ = -(uint)(auVar27._8_4_ < auVar71._8_4_);
                  auVar44._12_4_ = -(uint)(auVar27._12_4_ < auVar71._12_4_);
                  uVar6 = movmskps((int)uVar8,auVar44);
                  local_1770 = (ulong)uVar6;
                  if (uVar6 != 0) {
                    *(undefined1 (*) [16])paVar11[-3].v = auVar71;
                    *(undefined1 (*) [16])paVar11[-2].v = auVar27;
                    auVar71 = *(undefined1 (*) [16])(pNVar18 + -3);
                    auVar28._0_8_ = auVar71._8_8_;
                    auVar28._8_4_ = auVar71._0_4_;
                    auVar28._12_4_ = auVar71._4_4_;
                    *(undefined1 (*) [16])(pNVar18 + -3) = auVar28;
                  }
                }
              }
            }
            if (pRVar16 == (RayQueryContext *)&DAT_fffffffffffffff8) {
              return;
            }
            auVar29._4_4_ = -(uint)(aVar37.v[1] < (float)bi_8.field_0.i[1]);
            auVar29._0_4_ = -(uint)(aVar37.v[0] < (float)bi_8.field_0.i[0]);
            auVar29._8_4_ = -(uint)(aVar37.v[2] < (float)bi_8.field_0.i[2]);
            auVar29._12_4_ = -(uint)(aVar37.v[3] < (float)bi_8.field_0.i[3]);
            uVar6 = movmskps((int)local_1770,auVar29);
            local_1770 = (ulong)uVar6;
            if (uVar6 != 0) {
              uVar8 = (ulong)((uint)pRVar16 & 0xf) - 8;
              local_1770 = uVar8;
              if (uVar8 != 0) {
                uVar10 = 0;
                do {
                  local_1774 = *(uint *)(((ulong)pRVar16 & 0xfffffffffffffff0) + uVar10 * 8);
                  local_1770 = *(ulong *)(*(long *)(*(long *)ray + 0x1e8) + (ulong)local_1774 * 8);
                  uVar6 = *(uint *)(local_1770 + 0x34);
                  auVar30._0_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).occluded) == 0);
                  auVar30._4_4_ =
                       -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).occluded + 4)) == 0);
                  auVar30._8_4_ = -(uint)((uVar6 & *(uint *)&(This->intersector8).name) == 0);
                  auVar30._12_4_ =
                       -(uint)((uVar6 & *(uint *)((long)&(This->intersector8).name + 4)) == 0);
                  mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)(~auVar30 & auVar29);
                  uVar6 = movmskps((int)sVar13,(undefined1  [16])mask.field_0);
                  sVar13 = (size_t)uVar6;
                  if (uVar6 != 0) {
                    local_1790 = *(uint *)(((ulong)pRVar16 & 0xfffffffffffffff0) + 4 + uVar10 * 8);
                    context = (RayQueryContext *)(ulong)local_1790;
                    local_17a0 = &mask;
                    local_1798 = *(undefined8 *)(local_1770 + 0x18);
                    sVar13 = *(size_t *)(ray + 8);
                    local_1778 = 4;
                    local_1768 = 0;
                    local_1760 = *(long *)(ray + 0x10);
                    pcVar9 = *(code **)(local_1760 + 0x18);
                    if (pcVar9 == (code *)0x0) {
                      pcVar9 = *(code **)(local_1770 + 0x60);
                    }
                    local_1788 = sVar13;
                    local_1780 = This;
                    local_1770 = (*pcVar9)(&local_17a0);
                    iVar5 = 0x7f800000;
                    iVar78 = 0x7f800000;
                    iVar79 = 0x7f800000;
                    iVar81 = 0x7f800000;
                    fVar48 = local_1748;
                    fVar50 = fStack_1744;
                    fVar52 = fStack_1740;
                    fVar54 = fStack_173c;
                    fVar72 = local_1758;
                    fVar75 = fStack_1754;
                    fVar102 = fStack_1750;
                    fVar103 = fStack_174c;
                    fVar82 = local_1728;
                    fVar85 = fStack_1724;
                    fVar86 = fStack_1720;
                    fVar87 = fStack_171c;
                    fVar88 = local_1738;
                    fVar90 = fStack_1734;
                    fVar91 = fStack_1730;
                    fVar92 = fStack_172c;
                    fVar93 = local_1708;
                    fVar95 = fStack_1704;
                    fVar96 = fStack_1700;
                    fVar97 = fStack_16fc;
                    fVar98 = local_1718;
                    fVar99 = fStack_1714;
                    fVar100 = fStack_1710;
                    fVar101 = fStack_170c;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar8 != uVar10);
              }
              bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                             blendvps((undefined1  [16])bi_8.field_0,
                                      *(undefined1 (*) [16])&(This->intersector4_nofilter).name,
                                      auVar29);
            }
          }
LAB_00240e9b:
          pRVar16 = (RayQueryContext *)pNVar18[-1].ptr;
          pNVar18 = pNVar18 + -1;
        } while (pRVar16 != (RayQueryContext *)0xfffffffffffffff8);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }